

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int SetMaxAngleFromThreadIM483Ix(IM483I *pIM483I,double angle)

{
  int iVar1;
  CRITICAL_SECTION *__mutex;
  long lVar2;
  
  __mutex = IM483ICS;
  lVar2 = 0;
  do {
    if ((IM483I *)addrsIM483I[lVar2] == pIM483I) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      angleIM483I[lVar2] = angle;
      iVar1 = resIM483I[lVar2];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    lVar2 = lVar2 + 1;
    __mutex = __mutex + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int SetMaxAngleFromThreadIM483Ix(IM483I* pIM483I, double angle)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&IM483ICS[id]);
	angleIM483I[id] = angle;
	res = resIM483I[id];
	LeaveCriticalSection(&IM483ICS[id]);

	return res;
}